

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O0

UINT16 MakeTable(SCRATCH_DATA *Sd,UINT16 NumOfChar,UINT8 *BitLen,UINT16 TableBits,UINT16 *Table)

{
  UINT16 UVar1;
  short sVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  UINT16 MaxTableLength;
  UINT16 WordOfCount;
  UINT16 WordOfStart;
  UINT16 Mask;
  UINT16 NextCode;
  UINT16 Avail;
  UINT16 JuBits;
  UINT16 Char;
  UINT16 Len;
  UINT16 Index;
  UINT16 Index3;
  UINT16 *Pointer;
  UINT16 Start [18];
  short local_98 [4];
  UINT16 Weight [17];
  short asStack_68 [4];
  UINT16 Count [17];
  UINT16 *Table_local;
  UINT16 TableBits_local;
  UINT8 *BitLen_local;
  UINT16 NumOfChar_local;
  SCRATCH_DATA *Sd_local;
  
  if (TableBits < 0x11) {
    for (Avail = 0; Avail < 0x11; Avail = Avail + 1) {
      asStack_68[Avail] = 0;
    }
    for (Avail = 0; Avail < NumOfChar; Avail = Avail + 1) {
      if (0x10 < BitLen[Avail]) {
        return 0xffff;
      }
      asStack_68[BitLen[Avail]] = asStack_68[BitLen[Avail]] + 1;
    }
    for (Avail = 1; Avail < 0x11; Avail = Avail + 1) {
      Start[(long)(int)(Avail + 1) + -4] =
           Start[(ulong)Avail - 4] + (asStack_68[Avail] << (0x10U - (char)Avail & 0x1f));
    }
    if (Start[0xd] == 0) {
      bVar3 = (byte)TableBits;
      bVar7 = 0x10 - bVar3;
      local_98[0] = 0;
      for (Avail = 1; Avail <= TableBits; Avail = Avail + 1) {
        Start[(ulong)Avail - 4] = (UINT16)((int)(uint)Start[(ulong)Avail - 4] >> (bVar7 & 0x1f));
        local_98[Avail] = (short)(1 << (bVar3 - (char)Avail & 0x1f));
      }
      for (; Avail < 0x11; Avail = Avail + 1) {
        local_98[Avail] = (short)(1 << (0x10U - (char)Avail & 0x1f));
      }
      uVar5 = (int)(uint)Start[(long)(int)(TableBits + 1) + -4] >> (bVar7 & 0x1f);
      if (((short)uVar5 != 0) && (uVar6 = 1 << (bVar3 & 0x1f), (uVar5 & 0xffff) < (uVar6 & 0xffff)))
      {
        SetMem16(Table + (int)(uVar5 & 0xffff),(long)(int)((uVar6 & 0xffff) - (uVar5 & 0xffff)) << 1
                 ,0);
      }
      WordOfCount = NumOfChar;
      for (Mask = 0; Mask < NumOfChar; Mask = Mask + 1) {
        uVar4 = (ushort)BitLen[Mask];
        if ((uVar4 != 0) && (uVar4 < 0x11)) {
          UVar1 = Start[(ulong)uVar4 - 4];
          sVar2 = local_98[uVar4];
          if (TableBits < uVar4) {
            JuBits = Start[(ulong)uVar4 - 4];
            _Char = Table + ((int)(uint)JuBits >> (bVar7 & 0x1f));
            for (Avail = uVar4 - TableBits; Avail != 0; Avail = Avail - 1) {
              if ((*_Char == 0) && (WordOfCount < 0x3fb)) {
                Sd->mLeft[WordOfCount] = 0;
                Sd->mRight[WordOfCount] = 0;
                *_Char = WordOfCount;
                WordOfCount = WordOfCount + 1;
              }
              if (*_Char < 0x3fb) {
                if ((JuBits & (ushort)(1 << (0xf - bVar3 & 0x1f))) == 0) {
                  _Char = Sd->mLeft + *_Char;
                }
                else {
                  _Char = Sd->mRight + *_Char;
                }
              }
              JuBits = JuBits << 1;
            }
            *_Char = Mask;
          }
          else {
            for (Avail = Start[(ulong)uVar4 - 4]; Avail < (ushort)(UVar1 + sVar2); Avail = Avail + 1
                ) {
              if ((ushort)(1 << (bVar3 & 0x1f)) <= Avail) {
                return 0xffff;
              }
              Table[Avail] = Mask;
            }
          }
          Start[(ulong)uVar4 - 4] = UVar1 + sVar2;
        }
      }
      Sd_local._6_2_ = 0;
    }
    else {
      Sd_local._6_2_ = 0xffff;
    }
  }
  else {
    Sd_local._6_2_ = 0xffff;
  }
  return Sd_local._6_2_;
}

Assistant:

STATIC
UINT16
MakeTable (
    IN  SCRATCH_DATA  *Sd,
    IN  UINT16        NumOfChar,
    IN  UINT8         *BitLen,
    IN  UINT16        TableBits,
    OUT UINT16        *Table
    )
{
    UINT16  Count[17];
    UINT16  Weight[17];
    UINT16  Start[18];
    UINT16  *Pointer;
    UINT16  Index3;
    UINT16  Index;
    UINT16  Len;
    UINT16  Char;
    UINT16  JuBits;
    UINT16  Avail;
    UINT16  NextCode;
    UINT16  Mask;
    UINT16  WordOfStart;
    UINT16  WordOfCount;
    UINT16  MaxTableLength;

    //
    // The maximum mapping table width supported by this internal
    // working function is 16.
    //
    if (TableBits >= (sizeof(Count) / sizeof(UINT16))) {
        return (UINT16)BAD_TABLE;
    }

    //
    // Initialize Count array starting from Index 0, as there is a possibility of Count array being uninitialized.
    //
    for (Index = 0; Index <= 16; Index++) {
        Count[Index] = 0;
    }

    for (Index = 0; Index < NumOfChar; Index++) {
        if (BitLen[Index] > 16) {
            return (UINT16)BAD_TABLE;
        }
        Count[BitLen[Index]]++;
    }

    Start[0] = 0;
    Start[1] = 0;

    for (Index = 1; Index <= 16; Index++) {
        WordOfStart = Start[Index];
        WordOfCount = Count[Index];
        Start[Index + 1] = (UINT16)(WordOfStart + (WordOfCount << (16 - Index)));
    }

    if (Start[17] != 0) {
        /*(1U << 16)*/
        return (UINT16)BAD_TABLE;
    }

    JuBits = (UINT16)(16 - TableBits);

    Weight[0] = 0;
    for (Index = 1; Index <= TableBits; Index++) {
        Start[Index] >>= JuBits;
        Weight[Index] = (UINT16)(1U << (TableBits - Index));
    }

    while (Index <= 16) {
        Weight[Index] = (UINT16)(1U << (16 - Index));
        Index++;
    }

    Index = (UINT16)(Start[TableBits + 1] >> JuBits);

    if (Index != 0) {
        Index3 = (UINT16)(1U << TableBits);
        if (Index < Index3) {
            SetMem16 (Table + Index, (Index3 - Index) * sizeof(*Table), 0);
        }
    }

    Avail = NumOfChar;
    Mask = (UINT16)(1U << (15 - TableBits));
    MaxTableLength = (UINT16)(1U << TableBits);

    for (Char = 0; Char < NumOfChar; Char++) {
        Len = BitLen[Char];
        if (Len == 0 || Len >= 17) {
            continue;
        }

        NextCode = (UINT16)(Start[Len] + Weight[Len]);

        if (Len <= TableBits) {

            for (Index = Start[Len]; Index < NextCode; Index++) {
                if (Index >= MaxTableLength) {
                    return (UINT16)BAD_TABLE;
                }
                Table[Index] = Char;
            }

        }
        else {
            Index3 = Start[Len];
            Pointer = &Table[Index3 >> JuBits];
            Index = (UINT16)(Len - TableBits);

            while (Index != 0) {
                if (*Pointer == 0 && Avail < (2 * NC - 1)) {
                    Sd->mRight[Avail] = Sd->mLeft[Avail] = 0;
                    *Pointer = Avail++;
                }

                if (*Pointer < (2 * NC - 1)) {
                    if ((Index3 & Mask) != 0) {
                        Pointer = &Sd->mRight[*Pointer];
                    }
                    else {
                        Pointer = &Sd->mLeft[*Pointer];
                    }
                }

                Index3 <<= 1;
                Index--;
            }

            *Pointer = Char;

        }

        Start[Len] = NextCode;
    }
    //
    // Succeeds
    //
    return 0;
}